

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::addStorage
          (Span<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node> *this)

{
  byte bVar1;
  Entry *pEVar2;
  ulong uVar3;
  Entry *pEVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  ulong uStack_40;
  
  bVar1 = this->allocated;
  uVar3 = (ulong)bVar1;
  if (bVar1 == 0) {
    uStack_40 = 0x30;
  }
  else if (bVar1 == 0x30) {
    uStack_40 = 0x50;
  }
  else {
    uStack_40 = uVar3 + 0x10;
  }
  pEVar2 = (Entry *)operator_new__(uStack_40 * 0x28);
  lVar6 = 0;
  for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
    QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node::Node
              ((Node *)((pEVar2->storage).data + lVar6),
               (Node *)((this->entries->storage).data + lVar6));
    QCache<unsigned_long_long,_QOpenGLCachedTexture>::Value::~Value
              ((Value *)((this->entries->storage).data + lVar6 + 0x18));
    uVar3 = (ulong)this->allocated;
    lVar6 = lVar6 + 0x28;
  }
  pEVar4 = pEVar2 + uVar3;
  while (uVar3 < uStack_40) {
    uVar3 = uVar3 + 1;
    (pEVar4->storage).data[0] = (uchar)uVar3;
    pEVar4 = pEVar4 + 1;
  }
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = pEVar2;
  this->allocated = (uchar)uStack_40;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }